

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QString * __thiscall
QUrlPrivate::toLocalFile
          (QString *__return_storage_ptr__,QUrlPrivate *this,FormattingOptions options)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_const_QString_&> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  appendPath(this,(QString *)&local_38,options,Path);
  if ((this->host).d.size == 0) {
    QString::operator=(__return_storage_ptr__,(QString *)&local_38);
  }
  else {
    local_70.b = &this->host;
    local_70.a.m_size = 2;
    local_70.a.m_data = "//";
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
              ((QString *)&local_58,&local_70);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_58.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (local_38.size != 0) {
      bVar4 = QString::startsWith((QString *)&local_38,(QChar)0x2f,CaseSensitive);
      if (!bVar4) {
        QString::append(__return_storage_ptr__,(QChar)0x2f);
      }
    }
    QString::append(__return_storage_ptr__,(QString *)&local_38);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlPrivate::toLocalFile(QUrl::FormattingOptions options) const
{
    QString tmp;
    QString ourPath;
    appendPath(ourPath, options, QUrlPrivate::Path);

    // magic for shared drive on windows
    if (!host.isEmpty()) {
        tmp = "//"_L1 + host;
#ifdef Q_OS_WIN // QTBUG-42346, WebDAV is visible as local file on Windows only.
        if (scheme == webDavScheme())
            tmp += webDavSslTag();
#endif
        if (!ourPath.isEmpty() && !ourPath.startsWith(u'/'))
            tmp += u'/';
        tmp += ourPath;
    } else {
        tmp = ourPath;
#ifdef Q_OS_WIN
        // magic for drives on windows
        if (ourPath.length() > 2 && ourPath.at(0) == u'/' && ourPath.at(2) == u':')
            tmp.remove(0, 1);
#endif
    }
    return tmp;
}